

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

__pid_t __thiscall
kj::Promise<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_>::wait
          (Promise<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_> *this,void *__stat_loc)

{
  Own<kj::_::PromiseNode> *node;
  Maybe<kj::Own<kj::AsyncIoStream>_> *pMVar1;
  Exception *pEVar2;
  AsyncIoStream *in_RDX;
  Exception *exception_1;
  Exception *exception;
  Maybe<kj::Own<kj::AsyncIoStream>_> *value;
  undefined1 local_198 [8];
  ExceptionOr<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_> result;
  WaitScope *waitScope_local;
  Promise<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_> *this_local;
  
  result.value.ptr.field_1.value.ptr.ptr = in_RDX;
  _::ExceptionOr<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_>::ExceptionOr
            ((ExceptionOr<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_> *)local_198);
  node = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)__stat_loc);
  _::waitImpl(node,(ExceptionOrValue *)local_198,(WaitScope *)result.value.ptr.field_1.value.ptr.ptr
             );
  pMVar1 = _::readMaybe<kj::Maybe<kj::Own<kj::AsyncIoStream>>>
                     ((Maybe<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_> *)
                      ((long)&result.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
  if (pMVar1 != (Maybe<kj::Own<kj::AsyncIoStream>_> *)0x0) {
    pEVar2 = _::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_198);
    if (pEVar2 != (Exception *)0x0) {
      pEVar2 = mv<kj::Exception>(pEVar2);
      throwRecoverableException(pEVar2,0);
    }
    pMVar1 = mv<kj::Maybe<kj::Own<kj::AsyncIoStream>>>(pMVar1);
    pMVar1 = _::returnMaybeVoid<kj::Maybe<kj::Own<kj::AsyncIoStream>>>(pMVar1);
    Maybe<kj::Own<kj::AsyncIoStream>_>::Maybe((Maybe<kj::Own<kj::AsyncIoStream>_> *)this,pMVar1);
    _::ExceptionOr<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_>::~ExceptionOr
              ((ExceptionOr<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_> *)local_198);
    return (__pid_t)this;
  }
  pEVar2 = _::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_198);
  if (pEVar2 != (Exception *)0x0) {
    pEVar2 = mv<kj::Exception>(pEVar2);
    throwFatalException(pEVar2,0);
  }
  _::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }